

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  double dVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  _Bool _Var6;
  uint uVar7;
  ALLEGRO_SAMPLE *pAVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Token *pTVar11;
  Interp func;
  int y;
  int iVar12;
  Flair *pFVar13;
  Flair *__ptr;
  int iVar14;
  long lVar15;
  char *format;
  Flair *pFVar16;
  Sprite *pSVar17;
  Token *token;
  ulong uVar18;
  ALLEGRO_SAMPLE *(*papAVar19) [8];
  int i;
  Flair **ppFVar20;
  float *pfVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined4 uVar27;
  float fVar28;
  float end_time;
  int local_b8 [2];
  ALLEGRO_TIMER *local_b0;
  int local_98;
  int local_94;
  int local_78;
  
  cVar4 = al_install_system(0x85020700,atexit);
  if (cVar4 == '\0') {
    format = "Error initialising Allegro.\n";
  }
  else {
    cVar4 = al_install_audio();
    if (cVar4 == '\0') goto LAB_00103857;
    cVar4 = al_reserve_samples(0x80);
    if (cVar4 == '\0') goto LAB_00103857;
    al_init_acodec_addon();
    al_init_image_addon();
    al_set_new_bitmap_flags(0xc0);
    display = (ALLEGRO_DISPLAY *)al_create_display(0x400,600);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Error creating display.\n";
    }
    else {
      al_set_window_title(display,"Haiku - A Musical Instrument");
      images[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/earth4.png");
      images[1] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/wind3.png");
      images[2] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/water.png");
      images[3] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/fire.png");
      images[4] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/black_bead_opaque_A.png");
      images[5] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/dropshadow.png");
      images[8] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/air_effect.png");
      images[9] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/water_droplets.png");
      images[10] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/flame2.png");
      images[0xb] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/main_flame2.png");
      images[6] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/healthy_glow.png");
      images[7] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/overlay_pretty.png");
      lVar15 = 0;
      do {
        if (lVar15 == 0x60) goto LAB_00102697;
        plVar1 = (long *)((long)images + lVar15);
        lVar15 = lVar15 + 8;
      } while (*plVar1 != 0);
      format = "Error loading image.\n";
    }
  }
LAB_00102690:
  do {
    abort_example(format);
LAB_00102697:
    papAVar19 = element_samples;
    lVar15 = 0;
LAB_001026ac:
    if (lVar15 == 4) break;
    iVar12 = (&DAT_0010518c)[lVar15];
    uVar18 = 0;
    do {
      if (uVar18 == 8) goto LAB_001026f6;
      sprintf((char *)local_b8,"data/haiku/%s_%d.ogg",(long)&DAT_0010518c + (long)iVar12,
              uVar18 & 0xffffffff);
      pAVar8 = (ALLEGRO_SAMPLE *)al_load_sample(local_b8);
      (*papAVar19)[uVar18] = pAVar8;
      uVar18 = uVar18 + 1;
    } while (pAVar8 != (ALLEGRO_SAMPLE *)0x0);
    abort_example("Error loading %s.\n",local_b8);
LAB_00103857:
    format = "Error initialising audio.\n";
  } while( true );
  select_sample = (ALLEGRO_SAMPLE *)al_load_sample("data/haiku/select.ogg");
  if (select_sample != (ALLEGRO_SAMPLE *)0x0) {
    pSVar17 = &tokens[0].top;
    for (uVar18 = 0; uVar18 != 0x80; uVar18 = uVar18 + 1) {
      uVar7 = (uint)(uVar18 >> 4) & 0xfffffff;
      fVar26 = (float)((uint)uVar18 & 0xf) * 51.2 + 125.6;
      fVar28 = (float)uVar7 * 51.2 + 80.0;
      pSVar17[-2].anims[9].func = INTERP_DOUBLE_SLOW;
      pSVar17[-2].anims[9].start_time = fVar26;
      pSVar17[-2].anims[9].end_time = fVar28;
      *(uint *)&pSVar17[-2].anims[9].field_0x1c = 7 - uVar7;
      init_sprite(pSVar17 + -1,4,fVar26,fVar28,0.8,0.4);
      init_sprite(pSVar17,4,fVar26,fVar28,0.8,0.0);
      pSVar17 = (Sprite *)&pSVar17[2].y;
    }
    pSVar17 = &buttons[0].top;
    pfVar21 = (float *)&DAT_001051c0;
    for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
      fVar26 = *pfVar21 * 150.0 + 512.0;
      pSVar17[-2].anims[9].func = (Interp)lVar15;
      pSVar17[-2].anims[9].start_time = fVar26;
      pSVar17[-2].anims[9].end_time = 520.0;
      init_sprite(pSVar17 + -1,5,fVar26,520.0,0.6,0.4);
      pSVar17[-1].align_y = 0.0;
      init_sprite(pSVar17,(Interp)lVar15,fVar26,520.0,0.8,1.0);
      pSVar17 = (Sprite *)&pSVar17[2].y;
      pfVar21 = pfVar21 + 1;
    }
    init_sprite(&glow,6,512.0,600.0,1.0,1.0);
    glow.align_y = 1.0;
    glow.b = 0.0;
    glow.r = 0.0;
    glow.g = 0.0;
    uVar27 = 0;
    fVar26 = 0.0;
    uVar18 = 0x3f800000;
    init_sprite(&glow_overlay,7,0.0,0.0,1.0,1.0);
    glow_overlay.align_x = 0.0;
    glow_overlay.align_y = 0.0;
    glow_overlay.b = 0.0;
    glow_overlay.r = 0.0;
    glow_overlay.g = 0.0;
    uVar9 = al_map_rgb(0x6b,0x8e,0x23);
    glow_color[0].b = (float)uVar27;
    glow_color[0].r = (float)(int)uVar9;
    glow_color[0].g = (float)(int)((ulong)uVar9 >> 0x20);
    glow_color[0].a = fVar26;
    uVar9 = al_map_rgb(0xad,0xd8,0xe6);
    glow_color[1].b = (float)uVar27;
    glow_color[1].r = (float)(int)uVar9;
    glow_color[1].g = (float)(int)((ulong)uVar9 >> 0x20);
    glow_color[1].a = fVar26;
    uVar9 = al_map_rgb(0x41,0x69,0xe1);
    glow_color[2].b = (float)uVar27;
    glow_color[2].r = (float)(int)uVar9;
    glow_color[2].g = (float)(int)((ulong)uVar9 >> 0x20);
    glow_color[2].a = fVar26;
    uVar9 = al_map_rgb(0xff,0,0);
    glow_color[3].b = (float)uVar27;
    glow_color[3].r = (float)(int)uVar9;
    glow_color[3].g = (float)(int)((ulong)uVar9 >> 0x20);
    glow_color[3].a = fVar26;
    select_button(buttons);
    al_install_keyboard();
    al_install_mouse();
    refresh_timer = (ALLEGRO_TIMER *)al_create_timer(0x11111111);
    playback_timer = (ALLEGRO_TIMER *)al_create_timer(0x60000000);
    uVar9 = al_create_event_queue();
    uVar10 = al_get_display_event_source(display);
    al_register_event_source(uVar9,uVar10);
    uVar10 = al_get_keyboard_event_source();
    al_register_event_source(uVar9,uVar10);
    uVar10 = al_get_mouse_event_source();
    al_register_event_source(uVar9,uVar10);
    uVar10 = al_get_timer_event_source(refresh_timer);
    al_register_event_source(uVar9,uVar10);
    uVar10 = al_get_timer_event_source(playback_timer);
    al_register_event_source(uVar9,uVar10);
    cVar4 = al_is_touch_input_installed();
    if (cVar4 != '\0') {
      uVar10 = al_get_touch_input_mouse_emulation_event_source();
      al_register_event_source(uVar9,uVar10);
    }
    al_start_timer(refresh_timer);
    al_start_timer(playback_timer);
    do {
      bVar5 = al_is_event_queue_empty();
      if (bVar5 != 0) {
        dVar2 = (double)al_get_time();
        fVar26 = (float)dVar2;
        pFVar13 = flairs;
        pFVar16 = (Flair *)0x0;
LAB_00102aa7:
        __ptr = pFVar13;
        ppFVar20 = &pFVar16->next;
        if (pFVar16 == (Flair *)0x0) {
          ppFVar20 = &flairs;
        }
LAB_00102ab8:
        if (__ptr == (Flair *)0x0) {
          for (lVar15 = 0; lVar15 != 0x17800; lVar15 = lVar15 + 0x2f0) {
            update_token_anims((Token *)((long)(tokens[0].bot.anims + -2) + lVar15),fVar26);
          }
          for (lVar15 = 0; lVar15 != 0xbc0; lVar15 = lVar15 + 0x2f0) {
            update_token_anims((Token *)((long)(buttons[0].bot.anims + -2) + lVar15),fVar26);
          }
          update_sprite_anims(&glow,fVar26);
          pSVar17 = &glow_overlay;
          ppFVar20 = &flairs;
          do {
            update_sprite_anims(pSVar17,fVar26);
            ppFVar20 = &((Flair *)ppFVar20)->next->next;
            pSVar17 = &((Flair *)ppFVar20)->sprite;
          } while ((Flair *)ppFVar20 != (Flair *)0x0);
          al_map_rgb(0,0,0);
          al_clear_to_color();
          al_set_blender(0,2,1);
          draw_sprite(&glow);
          draw_sprite(&glow_overlay);
          for (lVar15 = 0; lVar15 != 0x17800; lVar15 = lVar15 + 0x2f0) {
            draw_token((Token *)((long)(tokens[0].bot.anims + -2) + lVar15));
          }
          al_set_blender(0,1,3);
          for (lVar15 = 0; lVar15 != 0xbc0; lVar15 = lVar15 + 0x2f0) {
            draw_token((Token *)((long)(buttons[0].bot.anims + -2) + lVar15));
          }
          al_set_blender(0,2,1);
          ppFVar20 = &flairs;
          while (ppFVar20 = &((Flair *)ppFVar20)->next->next, (Flair *)ppFVar20 != (Flair *)0x0) {
            draw_sprite(&((Flair *)ppFVar20)->sprite);
          }
          al_flip_display();
          goto LAB_00102c0f;
        }
        pFVar13 = __ptr->next;
        pFVar16 = __ptr;
        if (__ptr->end_time <= fVar26) goto code_r0x00102acd;
        goto LAB_00102aa7;
      }
LAB_00102c0f:
      bVar5 = bVar5 ^ 1;
      do {
        al_wait_for_event();
        if (local_b0 == refresh_timer) break;
        if (local_b0 == playback_timer) {
          for (iVar12 = 0; iVar12 != 8; iVar12 = iVar12 + 1) {
            lVar15 = (long)playback_column + (long)iVar12 * 0x10;
            if (tokens[lVar15].type < 4) {
              pSVar17 = &tokens[lVar15].top;
              switch(tokens[lVar15].type) {
              case 0:
                play_element(0,tokens[lVar15].pitch,0.8,0.0);
                fVar26 = tokens[lVar15].top.scale_x;
                anim(pSVar17,&tokens[lVar15].top.scale_x,fVar26 + 0.4,fVar26,INTERP_FAST,0.3);
                fVar26 = tokens[lVar15].top.scale_y;
                uVar18 = 0x3e99999a;
                anim(pSVar17,&tokens[lVar15].top.scale_y,fVar26 + 0.4,fVar26,INTERP_FAST,0.3);
                break;
              case 1:
                play_element(1,tokens[lVar15].pitch,0.8,0.0);
                pfVar21 = &tokens[lVar15].top.scale_x;
                anim_full(pSVar17,pfVar21,0.8,0.64,INTERP_SLOW_IN_OUT,0.0,0.5);
                anim_full(pSVar17,pfVar21,0.64,0.8,INTERP_SLOW_IN_OUT,0.5,0.8);
                pfVar21 = &tokens[lVar15].top.scale_y;
                anim_full(pSVar17,pfVar21,0.8,0.64,INTERP_SLOW_IN_OUT,0.0,0.5);
                anim_full(pSVar17,pfVar21,0.64,0.8,INTERP_SLOW_IN_OUT,0.5,0.8);
                fVar26 = tokens[lVar15].top.x;
                fVar28 = tokens[lVar15].top.y;
                dVar2 = (double)al_get_time();
                pSVar17 = make_flair(8,fVar26,fVar28,(float)dVar2 + 1.0);
                anim(pSVar17,&pSVar17->scale_x,0.9,1.3,INTERP_FAST,1.0);
                anim(pSVar17,&pSVar17->scale_y,0.9,1.3,INTERP_FAST,1.0);
                anim(pSVar17,&pSVar17->opacity,1.0,0.0,INTERP_FAST,1.0);
                pSVar17 = make_flair(8,fVar26,fVar28,(float)dVar2 + 1.2);
                anim(pSVar17,&pSVar17->opacity,1.0,0.0,INTERP_LINEAR,1.2);
                anim(pSVar17,&pSVar17->scale_x,1.1,1.5,INTERP_FAST,1.2);
                uVar18 = 0x3f99999a;
                anim(pSVar17,&pSVar17->scale_y,1.1,0.5,INTERP_FAST,1.2);
                anim_delta(pSVar17,&pSVar17->x,10.0,INTERP_FAST,1.2);
                break;
              case 2:
                play_element(2,tokens[lVar15].pitch,0.7,0.5);
                pfVar21 = &tokens[lVar15].top.scale_x;
                anim_full(pSVar17,pfVar21,1.04,0.64,INTERP_BOUNCE,0.0,0.5);
                anim_full(pSVar17,pfVar21,0.64,0.8,INTERP_BOUNCE,0.5,0.5);
                pfVar21 = &tokens[lVar15].top.scale_y;
                anim_full(pSVar17,pfVar21,0.64,1.04,INTERP_BOUNCE,0.0,0.5);
                anim_full(pSVar17,pfVar21,1.04,0.8,INTERP_BOUNCE,0.5,0.5);
                fVar26 = tokens[lVar15].top.x;
                fVar28 = tokens[lVar15].top.y;
                dVar2 = (double)al_get_time();
                end_time = (float)dVar2 + 1.0;
                pSVar17 = make_flair(2,fVar26,fVar28,end_time);
                anim(pSVar17,&pSVar17->scale_x,1.0,2.0,INTERP_FAST,0.5);
                anim(pSVar17,&pSVar17->scale_y,1.0,2.0,INTERP_FAST,0.5);
                uVar18 = 0x3f000000;
                anim(pSVar17,&pSVar17->opacity,0.5,0.0,INTERP_FAST,0.5);
                iVar14 = 0;
                while (iVar14 != -9) {
                  uVar18 = (ulong)(uint)end_time;
                  pSVar17 = make_flair(9,fVar26,fVar28,end_time);
                  fVar23 = random_float(0.3,1.2);
                  fVar24 = random_sign();
                  pSVar17->scale_x = fVar24 * fVar23;
                  fVar23 = random_float(0.3,1.2);
                  fVar24 = random_sign();
                  pSVar17->scale_y = fVar24 * fVar23;
                  fVar23 = random_float(0.0,6.2831855);
                  pSVar17->angle = fVar23;
                  fVar23 = random_float(0.0,0.6);
                  pSVar17->r = fVar23;
                  fVar23 = random_float(0.4,0.6);
                  pSVar17->g = fVar23;
                  pSVar17->b = 1.0;
                  bVar22 = iVar14 == 0;
                  iVar14 = iVar14 + -1;
                  if (bVar22) {
                    func = INTERP_LINEAR;
                    fVar23 = 1.0;
                  }
                  else {
                    fVar23 = random_float(0.7,1.0);
                    func = INTERP_DOUBLE_SLOW;
                  }
                  anim_to(pSVar17,&pSVar17->opacity,0.0,func,fVar23);
                  fVar23 = random_float(0.8,3.0);
                  fVar24 = random_float(0.7,1.0);
                  anim_to(pSVar17,&pSVar17->scale_x,fVar23,INTERP_FAST,fVar24);
                  fVar23 = random_float(0.8,3.0);
                  fVar24 = random_float(0.7,1.0);
                  anim_to(pSVar17,&pSVar17->scale_y,fVar23,INTERP_FAST,fVar24);
                  fVar23 = random_float(0.0,20.0);
                  fVar24 = random_sign();
                  fVar25 = random_float(0.7,1.0);
                  anim_delta(pSVar17,&pSVar17->x,fVar24 * fVar23,INTERP_FAST,fVar25);
                  fVar23 = random_float(0.0,20.0);
                  fVar24 = random_sign();
                  fVar25 = random_float(0.7,1.0);
                  anim_delta(pSVar17,&pSVar17->y,fVar24 * fVar23,INTERP_FAST,fVar25);
                }
                break;
              case 3:
                play_element(3,tokens[lVar15].pitch,0.8,0.0);
                anim(pSVar17,&tokens[lVar15].top.scale_x,1.04,0.8,INTERP_SLOW_IN_OUT,1.0);
                anim(pSVar17,&tokens[lVar15].top.scale_y,1.04,0.8,INTERP_SLOW_IN_OUT,1.0);
                fVar26 = tokens[lVar15].top.x;
                fVar28 = tokens[lVar15].top.y;
                dVar2 = (double)al_get_time();
                pSVar17 = make_flair(0xb,fVar26,fVar28,(float)dVar2 + 0.8);
                pSVar17->align_y = 0.75;
                anim_full(pSVar17,&pSVar17->scale_x,0.2,1.3,INTERP_BOUNCE,0.0,0.4);
                anim_full(pSVar17,&pSVar17->scale_y,0.2,1.3,INTERP_BOUNCE,0.0,0.4);
                anim_full(pSVar17,&pSVar17->scale_x,1.3,1.4,INTERP_BOUNCE,0.4,0.5);
                anim_full(pSVar17,&pSVar17->scale_y,1.3,1.4,INTERP_BOUNCE,0.4,0.5);
                uVar18 = 0x3e99999a;
                anim_full(pSVar17,&pSVar17->opacity,1.0,0.0,INTERP_FAST,0.3,0.5);
                for (iVar14 = 0; iVar14 != 3; iVar14 = iVar14 + 1) {
                  pSVar17 = make_flair(10,fVar26,fVar28,(float)dVar2 + 0.7);
                  pSVar17->align_x = 1.3;
                  pSVar17->angle = (float)iVar14 * 2.0943952;
                  anim_delta(pSVar17,&pSVar17->angle,-3.1415927,INTERP_DOUBLE_FAST,0.7);
                  anim(pSVar17,&pSVar17->opacity,1.0,0.0,INTERP_SLOW,0.7);
                  anim(pSVar17,&pSVar17->scale_x,0.2,1.0,INTERP_FAST,0.7);
                  uVar18 = 0x3f333333;
                  anim(pSVar17,&pSVar17->scale_y,0.2,1.0,INTERP_FAST,0.7);
                }
              }
            }
          }
          bVar22 = 0xe < playback_column;
          playback_column = playback_column + 1;
          if (bVar22) {
            playback_column = 0;
          }
        }
        else if (local_b8[0] == 10) {
          if (local_98 == 3) {
            for (lVar15 = 0; lVar15 != 0x17800; lVar15 = lVar15 + 0x2f0) {
              unselect_token((Token *)((long)(tokens[0].bot.anims + -2) + lVar15));
            }
          }
          else if (local_98 == 0x3b) {
LAB_00103817:
            while (flairs != (Flair *)0x0) {
              pFVar13 = flairs->next;
              free(flairs);
              flairs = pFVar13;
            }
            return 0;
          }
        }
        else if (local_b8[0] == 0x14) {
          pTVar11 = get_touched_token((float)local_98,(float)local_94);
          if (pTVar11 != hover_token) {
            if (hover_token != (Token *)0x0) {
              anim_to(&hover_token->bot,&(hover_token->bot).opacity,0.4,INTERP_DOUBLE_SLOW,0.2);
            }
            hover_token = pTVar11;
            if (pTVar11 != (Token *)0x0) {
              anim_to(&pTVar11->bot,&(pTVar11->bot).opacity,0.7,INTERP_FAST,0.2);
            }
          }
        }
        else if (local_b8[0] == 0x15) {
          fVar26 = (float)local_98;
          fVar28 = (float)local_94;
          if (local_78 == 2) {
            pTVar11 = get_touched_token(fVar26,fVar28);
            if (pTVar11 != (Token *)0x0) {
              unselect_token(pTVar11);
            }
          }
          else if (local_78 == 1) {
            pTVar11 = get_touched_token(fVar26,fVar28);
            if (pTVar11 == (Token *)0x0) {
              lVar15 = 5;
              pTVar11 = buttons;
              do {
                token = pTVar11;
                lVar15 = lVar15 + -1;
                if (lVar15 == 0) goto LAB_00103637;
                _Var6 = is_touched(token,fVar26,fVar28,(float)uVar18);
                pTVar11 = token + 1;
              } while (!_Var6);
              select_button(token);
            }
            else if (selected_button != (Token *)0x0) {
              uVar7 = pTVar11->type;
              unselect_token(pTVar11);
              if (uVar7 != selected_button->type) {
                (pTVar11->top).image = selected_button->type;
                anim_to(&pTVar11->top,&(pTVar11->top).opacity,1.0,INTERP_FAST,0.15);
                pTVar11->type = selected_button->type;
              }
            }
          }
        }
        else if (local_b8[0] == 0x2a) goto LAB_00103817;
LAB_00103637:
        bVar3 = bVar5 & 1;
        bVar5 = 0;
      } while (bVar3 == 0);
    } while( true );
  }
  format = "Error loading select.ogg.\n";
  select_sample = (ALLEGRO_SAMPLE *)0x0;
  goto LAB_00102690;
code_r0x00102acd:
  ((Flair *)ppFVar20)->next = pFVar13;
  free(__ptr);
  __ptr = pFVar13;
  goto LAB_00102ab8;
LAB_001026f6:
  lVar15 = lVar15 + 1;
  papAVar19 = papAVar19 + 1;
  goto LAB_001026ac;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Error initialising Allegro.\n");
   }
   if (!al_install_audio() || !al_reserve_samples(128)) {
      abort_example("Error initialising audio.\n");
   }
   al_init_acodec_addon();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);

   display = al_create_display(screen_w, screen_h);
   if (!display) {
      abort_example("Error creating display.\n");
   }
   al_set_window_title(display, "Haiku - A Musical Instrument");

   load_images();
   load_samples();

   init_tokens();
   init_buttons();
   init_glow();
   select_button(&buttons[TYPE_EARTH]);

   al_install_keyboard();
   al_install_mouse();

   refresh_timer = al_create_timer(1.0 / refresh_rate);
   playback_timer = al_create_timer(playback_period / TOKENS_X);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_timer_event_source(refresh_timer));
   al_register_event_source(queue, al_get_timer_event_source(playback_timer));
   if (al_is_touch_input_installed()) {
      al_register_event_source(queue,
         al_get_touch_input_mouse_emulation_event_source());
   }

   al_start_timer(refresh_timer);
   al_start_timer(playback_timer);

   main_loop(queue);

   free_all_flairs();

   return 0;
}